

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void __thiscall slang::ast::Scope::checkImportConflict(Scope *this,Symbol *member,Symbol *existing)

{
  SourceLocation noteLocation;
  ExplicitImportSymbol *pEVar1;
  ExplicitImportSymbol *pEVar2;
  Symbol *pSVar3;
  Symbol *pSVar4;
  long in_RDX;
  long in_RSI;
  Symbol *in_stack_00000020;
  Diagnostic *diag;
  Symbol *s2;
  Symbol *s1;
  ExplicitImportSymbol *eei;
  ExplicitImportSymbol *mei;
  undefined4 in_stack_ffffffffffffffa8;
  DiagCode noteCode;
  
  pEVar1 = Symbol::as<slang::ast::ExplicitImportSymbol>((Symbol *)0x6b4226);
  pEVar2 = Symbol::as<slang::ast::ExplicitImportSymbol>((Symbol *)0x6b4235);
  pSVar3 = ExplicitImportSymbol::importedSymbol((ExplicitImportSymbol *)diag);
  pSVar4 = ExplicitImportSymbol::importedSymbol((ExplicitImportSymbol *)diag);
  if ((pSVar3 != (Symbol *)0x0) && (pSVar4 != (Symbol *)0x0)) {
    if (pSVar3 == pSVar4) {
      if (((pEVar1->isFromExport & 1U) == 0) && ((pEVar2->isFromExport & 1U) == 0)) {
        noteCode = SUB84((ulong)*(undefined8 *)(in_RSI + 0x18) >> 0x20,0);
        addDiag((Scope *)eei,existing._4_4_,(SourceLocation)mei);
        noteLocation._4_4_ = 0xa0001;
        noteLocation._0_4_ = in_stack_ffffffffffffffa8;
        Diagnostic::addNote(*(Diagnostic **)(in_RDX + 0x18),noteCode,noteLocation);
      }
    }
    else {
      reportNameConflict((Scope *)s2,(Symbol *)diag,in_stack_00000020);
    }
  }
  return;
}

Assistant:

void Scope::checkImportConflict(const Symbol& member, const Symbol& existing) const {
    auto& mei = member.as<ExplicitImportSymbol>();
    auto& eei = existing.as<ExplicitImportSymbol>();

    auto s1 = mei.importedSymbol();
    auto s2 = eei.importedSymbol();
    if (!s1 || !s2)
        return;

    if (s1 == s2) {
        if (!mei.isFromExport && !eei.isFromExport) {
            // Duplicate explicit imports are specifically allowed,
            // so just ignore the other one (with a warning).
            auto& diag = addDiag(diag::DuplicateImport, member.location);
            diag.addNote(diag::NotePreviousDefinition, existing.location);
        }
    }
    else {
        reportNameConflict(member, existing);
    }
}